

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

QDateTimeEditPrivate * __thiscall
QDateTimeEditPrivate::validateAndInterpret
          (QDateTimeEditPrivate *this,QString *input,int *position,State *state,bool fixup)

{
  qsizetype *lhs;
  char16_t cVar1;
  char16_t cVar2;
  State SVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char16_t *pcVar7;
  undefined8 uVar8;
  qsizetype qVar9;
  PrivateShared *pPVar10;
  undefined8 uVar11;
  Data *pDVar12;
  bool bVar13;
  bool bVar14;
  char cVar15;
  short sVar16;
  short sVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  undefined7 in_register_00000081;
  uint *puVar21;
  char in_R9B;
  ulong uVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  PrivateShared *local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  puVar21 = (uint *)CONCAT71(in_register_00000081,fixup);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(position + 4) == 0) {
    if (input[0x2b].d.size == 1) {
      uVar19 = 1;
    }
    else {
      uVar19 = (uint)(input[0x1b].d.size != 0);
    }
    *puVar21 = uVar19;
    (*(code *)(input->d).d[10].super_QArrayData.alloc)(&local_58,input);
    ::QVariant::toDateTime();
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    bVar14 = ::comparesEqual(input + 0x22,(QString *)position);
    if (bVar14 && in_R9B == '\0') {
      *puVar21 = *(uint *)&input[0x28].d.ptr;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        ::QVariant::toDateTime();
        return this;
      }
      goto LAB_003c2609;
    }
    uVar4 = input[0x1b].d.size;
    if (uVar4 != 0) {
      uVar5 = *(ulong *)(position + 4);
      uVar20 = uVar5;
      if (uVar4 < uVar5) {
        uVar20 = uVar4;
      }
      lVar6 = *(long *)(position + 2);
      pcVar7 = input[0x1b].d.ptr;
      uVar23 = 0;
      iVar18 = (int)uVar20;
      uVar22 = 0;
      if (0 < iVar18) {
        uVar22 = uVar20 & 0xffffffff;
      }
      bVar14 = false;
      for (; uVar22 != uVar23; uVar23 = uVar23 + 1) {
        cVar1 = *(char16_t *)(lVar6 + uVar23 * 2);
        cVar2 = pcVar7[uVar23];
        bVar13 = bVar14;
        if (cVar1 != cVar2) {
          sVar16 = QChar::toLower((uint)(ushort)cVar2);
          sVar17 = QChar::toLower((uint)(ushort)cVar1);
          bVar13 = true;
          if (sVar16 != sVar17) {
            uVar22 = uVar23 & 0xffffffff;
            break;
          }
        }
        bVar14 = bVar13;
      }
      if ((int)uVar22 == iVar18) {
        *puVar21 = (uVar4 == uVar5) + 1;
        if (bVar14) {
          QString::left((QString *)&local_58,input + 0x1b,(long)iVar18);
          pPVar10 = *(PrivateShared **)position;
          uVar11 = *(undefined8 *)(position + 2);
          *(PrivateShared **)position = local_58.shared;
          *(undefined8 *)(position + 2) = local_58._8_8_;
          uVar8 = *(undefined8 *)(position + 4);
          *(undefined8 *)(position + 4) = local_58._16_8_;
          local_58.shared = pPVar10;
          local_58._8_8_ = uVar11;
          local_58._16_8_ = uVar8;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        }
        ::QVariant::toDateTime();
        goto LAB_003c25e1;
      }
    }
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    SVar3 = *state;
    ::QVariant::toDateTime();
    QDateTimeParser::parse
              ((QString *)&local_78,(int)input + 0x3d8,(QDateTime *)position,SUB41(SVar3,0));
    QDateTime::~QDateTime((QDateTime *)local_58.data);
    QString::operator=((QString *)position,(QString *)(input + 0x2a));
    QDateTime::toTimeZone((QTimeZone *)&local_58.shared);
    pPVar10 = local_78;
    local_78 = local_58.shared;
    local_58.shared = pPVar10;
    QDateTime::~QDateTime((QDateTime *)local_58.data);
    cVar15 = QDateTime::isValid();
    uVar19 = (uint)uStack_70;
    if ((uint)uStack_70 == 2 && cVar15 == '\0') {
      uStack_70 = (undefined1 *)CONCAT44(uStack_70._4_4_,1);
      uVar19 = 1;
    }
    *state = *state + uStack_70._4_4_;
    *puVar21 = uVar19;
    if (uVar19 == 2) {
      if ((char)local_68 == '\x01') {
        lhs = &input[0x33].d.size;
        ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
        bVar14 = ::operator!=((QVariant *)lhs,(QVariant *)&local_58);
        ::QVariant::~QVariant((QVariant *)&local_58);
        if (bVar14) {
          ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
          ::QVariant::operator=((QVariant *)lhs,(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
          (*(code *)(input->d).d[0xf].super_QArrayData.alloc)(input);
          ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
          (*(code *)(input->d).d[0xd].super_QArrayData.alloc)(&local_98,input,&local_58);
          pDVar12 = *(Data **)position;
          pcVar7 = *(char16_t **)(position + 2);
          *(Data **)position = local_98.d;
          *(char16_t **)(position + 2) = local_98.ptr;
          qVar9 = *(qsizetype *)(position + 4);
          *(qsizetype *)(position + 4) = local_98.size;
          local_98.d = pDVar12;
          local_98.ptr = pcVar7;
          local_98.size = qVar9;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          ::QVariant::~QVariant((QVariant *)&local_58);
          ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
          updateCache((QDateTimeEditPrivate *)input,(QVariant *)&local_58,(QString *)position);
          ::QVariant::~QVariant((QVariant *)&local_58);
          ::QVariant::clear();
          goto LAB_003c2587;
        }
      }
      QString::operator=(input + 0x22,(QString *)position);
      *(uint *)&input[0x28].d.ptr = *puVar21;
      ::QVariant::QVariant((QVariant *)&local_58,(QDateTime *)&local_78);
      ::QVariant::operator=((QVariant *)(input + 0x23),(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    else {
      (*(code *)(input->d).d[0xf].super_QArrayData.alloc)(input);
    }
LAB_003c2587:
    cVar15 = QDateTime::isNull();
    if (cVar15 == '\0') {
      QDateTime::QDateTime((QDateTime *)this,(QDateTime *)&local_78);
    }
    else {
      (*(code *)(input->d).d[10].super_QArrayData.alloc)(&local_58,input);
      ::QVariant::toDateTime();
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    QDateTime::~QDateTime((QDateTime *)&local_78);
  }
LAB_003c25e1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_003c2609:
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEditPrivate::validateAndInterpret(QString &input, int &position,
                                                     QValidator::State &state, bool fixup) const
{
    if (input.isEmpty()) {
        if (sectionNodes.size() == 1 || !specialValueText.isEmpty()) {
            state = QValidator::Intermediate;
        } else {
            state = QValidator::Invalid;
        }
        return getZeroVariant().toDateTime();
    } else if (cachedText == input && !fixup) {
        state = cachedState;
        return cachedValue.toDateTime();
    } else if (!specialValueText.isEmpty()) {
        bool changeCase = false;
        const int max = qMin(specialValueText.size(), input.size());
        int i;
        for (i=0; i<max; ++i) {
            const QChar ic = input.at(i);
            const QChar sc = specialValueText.at(i);
            if (ic != sc) {
                if (sc.toLower() == ic.toLower()) {
                    changeCase = true;
                } else {
                    break;
                }
            }
        }
        if (i == max) {
            state = specialValueText.size() == input.size() ? QValidator::Acceptable : QValidator::Intermediate;
            if (changeCase) {
                input = specialValueText.left(max);
            }
            return minimum.toDateTime();
        }
    }

    StateNode tmp = parse(input, position, value.toDateTime(), fixup);
    // Take note of any corrections imposed during parsing:
    input = m_text;
    // TODO: if the format specifies time-zone, update timeZone to match the
    // parsed text; but we're in const context, so can't - QTBUG-118393.
    // Impose this widget's time system:
    tmp.value = tmp.value.toTimeZone(timeZone);
    // ... but that might turn a valid datetime into an invalid one:
    if (!tmp.value.isValid() && tmp.state == Acceptable)
        tmp.state = Intermediate;

    position += tmp.padded;
    state = QValidator::State(int(tmp.state));
    if (state == QValidator::Acceptable) {
        if (tmp.conflicts && conflictGuard != tmp.value) {
            conflictGuard = tmp.value;
            clearCache();
            input = textFromValue(tmp.value);
            updateCache(tmp.value, input);
            conflictGuard.clear();
        } else {
            cachedText = input;
            cachedState = state;
            cachedValue = tmp.value;
        }
    } else {
        clearCache();
    }
    return (tmp.value.isNull() ? getZeroVariant().toDateTime() : tmp.value);
}